

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<Fad<double>,_20>::Resize(TPZManVector<Fad<double>,_20> *this,int64_t newsize)

{
  undefined8 *puVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  Fad<double> *pFVar6;
  Vector<double> *this_00;
  double dVar7;
  
  if (-1 < newsize) {
    lVar3 = (this->super_TPZVec<Fad<double>_>).fNElements;
    if (lVar3 != newsize) {
      lVar5 = (this->super_TPZVec<Fad<double>_>).fNAlloc;
      if (lVar5 < newsize) {
        if ((ulong)newsize < 0x15) {
          pFVar6 = (this->super_TPZVec<Fad<double>_>).fStore;
          if (pFVar6 != this->fExtAlloc) {
            if (0 < lVar3) {
              lVar5 = 0;
              lVar3 = 0;
              do {
                puVar1 = (undefined8 *)
                         ((long)&((this->super_TPZVec<Fad<double>_>).fStore)->val_ + lVar5);
                *(undefined8 *)((long)&this->fExtAlloc[0].val_ + lVar5) = *puVar1;
                Vector<double>::operator=
                          ((Vector<double> *)((long)&this->fExtAlloc[0].dx_.num_elts + lVar5),
                           (Vector<double> *)(puVar1 + 1));
                *(undefined8 *)((long)&this->fExtAlloc[0].defaultVal + lVar5) = puVar1[3];
                lVar3 = lVar3 + 1;
                lVar5 = lVar5 + 0x20;
              } while (lVar3 < (this->super_TPZVec<Fad<double>_>).fNElements);
              pFVar6 = (this->super_TPZVec<Fad<double>_>).fStore;
            }
            if (pFVar6 != (Fad<double> *)0x0) {
              dVar7 = pFVar6[-1].defaultVal;
              if (dVar7 != 0.0) {
                lVar3 = (long)dVar7 << 5;
                do {
                  Fad<double>::~Fad((Fad<double> *)((long)&pFVar6[-1].val_ + lVar3));
                  lVar3 = lVar3 + -0x20;
                } while (lVar3 != 0);
              }
              operator_delete__(&pFVar6[-1].defaultVal,(long)dVar7 << 5 | 8);
            }
            (this->super_TPZVec<Fad<double>_>).fStore = this->fExtAlloc;
          }
          (this->super_TPZVec<Fad<double>_>).fNElements = newsize;
          (this->super_TPZVec<Fad<double>_>).fNAlloc = 0;
        }
        else {
          dVar7 = (double)lVar5 * 1.2;
          uVar4 = (long)dVar7;
          if (dVar7 < (double)newsize) {
            uVar4 = newsize;
          }
          puVar2 = (ulong *)operator_new__(-(ulong)(uVar4 >> 0x3b != 0) | uVar4 * 0x20 | 8);
          *puVar2 = uVar4;
          if (uVar4 != 0) {
            lVar3 = 0;
            pFVar6 = (Fad<double> *)(puVar2 + 1);
            do {
              Fad<double>::Fad(pFVar6);
              lVar3 = lVar3 + -0x20;
              pFVar6 = pFVar6 + 1;
            } while (-lVar3 != uVar4 * 0x20);
            lVar3 = (this->super_TPZVec<Fad<double>_>).fNElements;
          }
          if (0 < lVar3) {
            this_00 = (Vector<double> *)(puVar2 + 2);
            lVar5 = 0;
            lVar3 = 0;
            do {
              puVar1 = (undefined8 *)
                       ((long)&((this->super_TPZVec<Fad<double>_>).fStore)->val_ + lVar5);
              this_00[-1].ptr_to_data = (double *)*puVar1;
              Vector<double>::operator=(this_00,(Vector<double> *)(puVar1 + 1));
              *(undefined8 *)(this_00 + 1) = puVar1[3];
              lVar3 = lVar3 + 1;
              this_00 = this_00 + 2;
              lVar5 = lVar5 + 0x20;
            } while (lVar3 < (this->super_TPZVec<Fad<double>_>).fNElements);
          }
          pFVar6 = (this->super_TPZVec<Fad<double>_>).fStore;
          if (pFVar6 != (Fad<double> *)0x0 && pFVar6 != this->fExtAlloc) {
            dVar7 = pFVar6[-1].defaultVal;
            if (dVar7 != 0.0) {
              lVar3 = (long)dVar7 << 5;
              do {
                Fad<double>::~Fad((Fad<double> *)((long)&pFVar6[-1].val_ + lVar3));
                lVar3 = lVar3 + -0x20;
              } while (lVar3 != 0);
            }
            operator_delete__(&pFVar6[-1].defaultVal,(long)dVar7 << 5 | 8);
          }
          (this->super_TPZVec<Fad<double>_>).fStore = (Fad<double> *)(puVar2 + 1);
          (this->super_TPZVec<Fad<double>_>).fNElements = newsize;
          (this->super_TPZVec<Fad<double>_>).fNAlloc = uVar4;
        }
      }
      else {
        (this->super_TPZVec<Fad<double>_>).fNElements = newsize;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}